

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O2

char * A64NamedImmMapper_toString(A64NamedImmMapper *N,uint32_t Value,_Bool *Valid)

{
  A64NamedImmMapper_Mapping *pAVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (N->NumPairs <= uVar3) {
      *Valid = false;
      return (char *)0x0;
    }
    pAVar1 = N->Pairs;
    uVar2 = (ulong)((int)uVar3 + 1);
  } while (pAVar1[uVar3].Value != Value);
  *Valid = true;
  return pAVar1[uVar3].Name;
}

Assistant:

char *A64NamedImmMapper_toString(A64NamedImmMapper *N, uint32_t Value, bool *Valid)
{
	unsigned i;
	for (i = 0; i < N->NumPairs; ++i) {
		if (N->Pairs[i].Value == Value) {
			*Valid = true;
			return N->Pairs[i].Name;
		}
	}

	*Valid = false;
	return 0;
}